

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall
QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::~QExplicitlySharedDataPointer
          (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *this)

{
  DeclarationData *pDVar1;
  Data *pDVar2;
  
  pDVar1 = (this->d).ptr;
  if (pDVar1 != (DeclarationData *)0x0) {
    LOCK();
    (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      pDVar1 = (this->d).ptr;
      if (pDVar1 != (DeclarationData *)0x0) {
        ::QVariant::~QVariant(&pDVar1->parsed);
        QArrayDataPointer<QCss::Value>::~QArrayDataPointer(&(pDVar1->values).d);
        pDVar2 = (pDVar1->property).d.d;
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
          UNLOCK();
          if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
            QArrayData::deallocate(&((pDVar1->property).d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      operator_delete(pDVar1,0x68);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }